

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RSI;
  undefined8 *in_RDI;
  SpatialVector_t *in_stack_fffffffffffffe28;
  SpatialVector_t *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffe38;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffe40;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_00;
  void *local_1a0;
  SpatialVector *in_stack_fffffffffffffe88;
  Joint *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  SpatialVector_t *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffec0;
  
  *(undefined4 *)((long)in_RDI + 0xc) = 1;
  uVar3 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  if (uVar3 != 0) {
    local_1a0 = pvVar5;
    do {
      SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x23e139);
      local_1a0 = (void *)((long)local_1a0 + 0x30);
    } while (local_1a0 != (void *)((long)pvVar5 + uVar3 * 0x30));
  }
  *in_RDI = pvVar5;
  SpatialVector_t::SpatialVector_t(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SpatialVector_t::operator=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,(double *)in_stack_fffffffffffffe90,
             (double *)in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
  bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 1) = 3;
  }
  else {
    this_00 = in_RSI;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,(double *)in_stack_fffffffffffffe90,
               (double *)in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
    bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      (this_00,in_stack_fffffffffffffe38);
    if (bVar2) {
      *(undefined4 *)(in_RDI + 1) = 4;
    }
    else {
      in_stack_fffffffffffffe90 = (Joint *)0x0;
      in_stack_fffffffffffffe88 = (SpatialVector *)0x0;
      SpatialVector_t::SpatialVector_t
                ((SpatialVector_t *)0x0,(double *)0x0,(double *)0x3ff0000000000000,(double *)0x0,
                 (double *)0x0,(double *)0x0,in_stack_fffffffffffffec0);
      bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==(this_00,in_RSI);
      if (bVar2) {
        *(undefined4 *)(in_RDI + 1) = 5;
      }
      else {
        *(undefined4 *)(in_RDI + 1) = 0xc;
      }
    }
  }
  validate_spatial_axis(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  return;
}

Assistant:

Joint (
			const Math::SpatialVector &axis_0
			) {
		mDoFCount = 1;
		mJointAxes = new Math::SpatialVector[mDoFCount];
		mJointAxes[0] = Math::SpatialVector (axis_0);
		if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteX;
		} else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteY;
		} else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteZ;
		} else {
			mJointType = JointType1DoF;
		}
		validate_spatial_axis (mJointAxes[0]);
	}